

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O1

void ipc_listener_cb(void *arg,uint events)

{
  nni_mtx_lock((nni_mtx *)((long)arg + 0x140));
  if ((events & 0x20) == 0) {
    ipc_listener_doaccept((ipc_listener *)arg);
  }
  else {
    ipc_listener_doclose((ipc_listener *)arg);
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x140));
  return;
}

Assistant:

static void
ipc_listener_cb(void *arg, unsigned events)
{
	ipc_listener *l = arg;

	nni_mtx_lock(&l->mtx);
	if ((events & NNI_POLL_INVAL) != 0) {
		ipc_listener_doclose(l);
		nni_mtx_unlock(&l->mtx);
		return;
	}

	// Anything else will turn up in accept.
	ipc_listener_doaccept(l);
	nni_mtx_unlock(&l->mtx);
}